

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

PassToken spvtools::CreateCopyPropagateArraysPass(void)

{
  MemPass *this;
  undefined8 *puVar1;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  in_RDI;
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_18;
  
  this = (MemPass *)operator_new(0xe0);
  memset(this,0,0xe0);
  opt::MemPass::MemPass(this);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__MemPass_003ddef0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this;
  *(undefined8 **)
   in_RDI._M_t.
   super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
   .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl = puVar1;
  local_18._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                 *)&local_18);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
}

Assistant:

Optimizer::PassToken CreateCopyPropagateArraysPass() {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::CopyPropagateArrays>());
}